

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::SingularVarBigint<int,unsigned_char,true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  ushort *ptr_00;
  uint *puVar4;
  ulong uVar5;
  
  if (-1 < *ptr) {
    protobuf_assumption_failed
              ("static_cast<int8_t>(*ptr) < 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
               ,0x39f);
  }
  uVar2 = (long)ptr[1] << 7 | 0x7f;
  if ((long)uVar2 < 0) {
    uVar5 = (long)ptr[2] << 0xe | 0x3fff;
    if ((long)uVar5 < 0) {
      uVar2 = uVar2 & ((long)ptr[3] << 0x15 | 0x1fffffU);
      if ((long)uVar2 < 0) {
        uVar5 = uVar5 & ((long)ptr[4] << 0x1c | 0xfffffffU);
        if ((long)uVar5 < 0) {
          uVar2 = uVar2 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
          if ((long)uVar2 < 0) {
            uVar5 = uVar5 & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
            if ((long)uVar5 < 0) {
              uVar2 = uVar2 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
              if ((long)uVar2 < 0) {
                uVar5 = uVar5 & ((ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff);
                if ((long)uVar5 < 0) {
                  ptr_00 = (ushort *)(ptr + 10);
                  if ((ptr[9] != '\x01') && (ptr[9] < '\0')) {
                    pcVar3 = Error(msg,(char *)ptr_00,ctx,data,table,hasbits);
                    return pcVar3;
                  }
                }
                else {
                  ptr_00 = (ushort *)(ptr + 9);
                }
              }
              else {
                ptr_00 = (ushort *)(ptr + 8);
              }
            }
            else {
              ptr_00 = (ushort *)(ptr + 7);
            }
          }
          else {
            ptr_00 = (ushort *)(ptr + 6);
          }
        }
        else {
          ptr_00 = (ushort *)(ptr + 5);
        }
      }
      else {
        ptr_00 = (ushort *)(ptr + 4);
      }
    }
    else {
      ptr_00 = (ushort *)(ptr + 3);
    }
    uVar2 = uVar2 & uVar5;
  }
  else {
    ptr_00 = (ushort *)(ptr + 2);
  }
  puVar4 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar4 & 3) == 0) {
    uVar1 = (uint)uVar2 & (int)*ptr;
    *puVar4 = -(uVar1 & 1) ^ uVar1 >> 1;
    if (ptr_00 < (ctx->super_EpsCopyInputStream).limit_end_) {
      uVar1 = (uint)table->fast_idx_mask & (uint)*ptr_00;
      if ((uVar1 & 7) == 0) {
        pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + (uVar1 & 0xfffffff8)))();
        return pcVar3;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    if ((ulong)table->has_bits_offset != 0) {
      puVar4 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar4 & 3) != 0) goto LAB_0028b2f2;
      *puVar4 = *puVar4 | (uint)hasbits;
    }
    return (char *)ptr_00;
  }
LAB_0028b2f2:
  AlignFail(puVar4);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::SingularVarBigint(
    PROTOBUF_TC_PARAM_DECL) {
  uint64_t tmp;
  PROTOBUF_ASSUME(static_cast<int8_t>(*ptr) < 0);
  ptr = ParseVarint(ptr, &tmp);

  if (ABSL_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  RefAt<FieldType>(msg, data.offset()) =
      ZigZagDecodeHelper<FieldType, zigzag>(tmp);
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}